

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenerateNestedVerifierTypes_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type)

{
  string string_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  GenType_abi_cxx11_(&local_30,this,type,false);
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
LAB_00220f16:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_30);
  }
  else {
    if (type->base_type == BASE_TYPE_STRING) {
      std::operator+(&local_50,"ForwardOffset<",&local_30);
      std::operator+(__return_storage_ptr__,&local_50,">");
    }
    else {
      if ((type->struct_def != (StructDef *)0x0) && (type->struct_def->fixed == true))
      goto LAB_00220f16;
      std::operator+(&local_50,"ForwardOffset<",&local_30);
      std::operator+(__return_storage_ptr__,&local_50,">");
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateNestedVerifierTypes(const Type &type) {
    const auto string_type = GenType(type);

    if (IsScalar(type.base_type)) { return string_type; }

    if (IsString(type)) { return "ForwardOffset<" + string_type + ">"; }

    if (type.struct_def && type.struct_def->fixed) { return string_type; }

    return "ForwardOffset<" + string_type + ">";
  }